

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSplit.c
# Opt level: O3

int Spl_ManFindGoodCand(Spl_Man_t *p)

{
  uint *puVar1;
  uint uVar2;
  int iObj;
  int *piVar3;
  Vec_Bit_t *pVVar4;
  byte bVar5;
  int iVar6;
  Vec_Int_t *pVVar7;
  Vec_Int_t *pVVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  
  pVVar7 = p->vInputs;
  iVar11 = pVVar7->nSize;
  if (0 < iVar11) {
    piVar3 = pVVar7->pArray;
    pVVar4 = p->vMarksIn;
    lVar10 = 0;
    do {
      uVar2 = piVar3[lVar10];
      if (((int)uVar2 < 0) || (pVVar4->nSize <= (int)uVar2)) goto LAB_007cbc76;
      puVar1 = (uint *)(pVVar4->pArray + (uVar2 >> 5));
      *puVar1 = *puVar1 | 1 << ((byte)uVar2 & 0x1f);
      lVar10 = lVar10 + 1;
      iVar11 = pVVar7->nSize;
    } while (lVar10 < iVar11);
  }
  pVVar8 = p->vCands;
  if (pVVar8->nSize < 1) {
    iVar9 = 0;
  }
  else {
    lVar10 = 0;
    iVar11 = -1;
    iVar9 = 0;
    do {
      iObj = pVVar8->pArray[lVar10];
      iVar6 = Spl_ManCountMarkedFanins(p->pGia,iObj,p->vMarksIn);
      if (iVar11 < iVar6) {
        iVar9 = iObj;
      }
      if (iVar11 <= iVar6) {
        iVar11 = iVar6;
      }
      lVar10 = lVar10 + 1;
      pVVar8 = p->vCands;
    } while (lVar10 < pVVar8->nSize);
    pVVar7 = p->vInputs;
    iVar11 = pVVar7->nSize;
  }
  if (0 < iVar11) {
    piVar3 = pVVar7->pArray;
    pVVar4 = p->vMarksIn;
    lVar10 = 0;
    do {
      uVar2 = piVar3[lVar10];
      if (((int)uVar2 < 0) || (pVVar4->nSize <= (int)uVar2)) {
LAB_007cbc76:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                      ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
      }
      bVar5 = (byte)uVar2 & 0x1f;
      puVar1 = (uint *)(pVVar4->pArray + (uVar2 >> 5));
      *puVar1 = *puVar1 & (-2 << bVar5 | 0xfffffffeU >> 0x20 - bVar5);
      lVar10 = lVar10 + 1;
    } while (lVar10 < pVVar7->nSize);
  }
  return iVar9;
}

Assistant:

int Spl_ManFindGoodCand( Spl_Man_t * p )
{
    int i, iObj;
    int Res = 0, InCount, InCountMax = -1; 
    // mark leaves
    Vec_IntForEachEntry( p->vInputs, iObj, i )
        Vec_BitWriteEntry( p->vMarksIn, iObj, 1 );
    // find candidate with maximum input overlap
    Vec_IntForEachEntry( p->vCands, iObj, i )
    {
        InCount = Spl_ManCountMarkedFanins( p->pGia, iObj, p->vMarksIn );
        if ( InCountMax < InCount )
        {
            InCountMax = InCount;
            Res = iObj;
        }
    }
    // unmark leaves
    Vec_IntForEachEntry( p->vInputs, iObj, i )
        Vec_BitWriteEntry( p->vMarksIn, iObj, 0 );
    return Res;
}